

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

void Diligent::ValidatePSOCreateInfo<Diligent::TilePipelineStateCreateInfo>
               (IRenderDevice *pDevice,TilePipelineStateCreateInfo *CreateInfo)

{
  PIPELINE_TYPE PipelineType;
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char (*in_RCX) [19];
  char (*Args_1) [19];
  IShader *pIVar3;
  string msg;
  char *local_28;
  
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x65cc22,in_RCX);
    Args_1 = (char (*) [19])0x3c7;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidatePSOCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x3c7);
    std::__cxx11::string::~string((string *)&msg);
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x65cc22,Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateTilePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x312);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  PipelineType = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  if (PipelineType != PIPELINE_TYPE_LAST) {
    msg._M_dataplus._M_p = GetPipelineTypeString(PipelineType);
    pcVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_28 = "";
    if (pcVar1 != (char *)0x0) {
      local_28 = pcVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28]>
              (false,"ValidateTilePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x317,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x5b3270,
               &local_28,(char (*) [15])"\' is invalid: ",
               (char (*) [28])"Pipeline type must be TILE.");
  }
  anon_unknown_61::ValidatePipelineResourceSignatures
            (&CreateInfo->super_PipelineStateCreateInfo,pDevice);
  anon_unknown_61::ValidatePipelineResourceLayoutDesc
            ((PipelineStateDesc *)CreateInfo,(DeviceFeatures *)(CONCAT44(extraout_var,iVar2) + 0xc))
  ;
  pIVar3 = CreateInfo->pTS;
  if (pIVar3 == (IShader *)0x0) {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    pcVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_28 = "";
    if (pcVar1 != (char *)0x0) {
      local_28 = pcVar1;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[30]>
              (false,"ValidateTilePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x31d,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x5b3270,
               &local_28,(char (*) [15])"\' is invalid: ",
               (char (*) [30])"Tile shader must not be null.");
    pIVar3 = CreateInfo->pTS;
    if (pIVar3 == (IShader *)0x0) {
      return;
    }
  }
  iVar2 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var_00,iVar2) + 8) != 0x4000) {
    iVar2 = (*(CreateInfo->pTS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    msg._M_dataplus._M_p =
         GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_01,iVar2) + 8));
    LogError<true,char_const*,char[26],char[5],char[8]>
              (false,"ValidateTilePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,799,(char **)&msg,(char (*) [26])" is not a valid type for ",(char (*) [5])0x639a0d,
               (char (*) [8])0x65cad3);
  }
  return;
}

Assistant:

void ValidatePSOCreateInfo<TilePipelineStateCreateInfo>(const IRenderDevice*               pDevice,
                                                        const TilePipelineStateCreateInfo& CreateInfo) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    ValidateTilePipelineCreateInfo(CreateInfo, pDevice);
}